

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

ValidateXrFlagsResult ValidateXrKeyboardTrackingFlagsFB(XrFlags64 value)

{
  undefined8 local_20;
  XrFlags64 int_value;
  XrFlags64 value_local;
  
  if (value == 0) {
    value_local._4_4_ = VALIDATE_XR_FLAGS_ZERO;
  }
  else {
    local_20 = value;
    if ((value & 1) != 0) {
      local_20 = value & 0xfffffffffffffffe;
    }
    if ((local_20 & 2) != 0) {
      local_20 = local_20 & 0xfffffffffffffffd;
    }
    if ((local_20 & 4) != 0) {
      local_20 = local_20 & 0xfffffffffffffffb;
    }
    if ((local_20 & 8) != 0) {
      local_20 = local_20 & 0xfffffffffffffff7;
    }
    if (local_20 == 0) {
      value_local._4_4_ = VALIDATE_XR_FLAGS_SUCCESS;
    }
    else {
      value_local._4_4_ = VALIDATE_XR_FLAGS_INVALID;
    }
  }
  return value_local._4_4_;
}

Assistant:

ValidateXrFlagsResult ValidateXrKeyboardTrackingFlagsFB(const XrFlags64 value) {
    if (0 == value) {
        return VALIDATE_XR_FLAGS_ZERO;
    }
    XrFlags64 int_value = value;
    if ((int_value & XR_KEYBOARD_TRACKING_EXISTS_BIT_FB) != 0) {
        // Clear the value XR_KEYBOARD_TRACKING_EXISTS_BIT_FB since it is valid
        int_value &= ~XR_KEYBOARD_TRACKING_EXISTS_BIT_FB;
    }
    if ((int_value & XR_KEYBOARD_TRACKING_LOCAL_BIT_FB) != 0) {
        // Clear the value XR_KEYBOARD_TRACKING_LOCAL_BIT_FB since it is valid
        int_value &= ~XR_KEYBOARD_TRACKING_LOCAL_BIT_FB;
    }
    if ((int_value & XR_KEYBOARD_TRACKING_REMOTE_BIT_FB) != 0) {
        // Clear the value XR_KEYBOARD_TRACKING_REMOTE_BIT_FB since it is valid
        int_value &= ~XR_KEYBOARD_TRACKING_REMOTE_BIT_FB;
    }
    if ((int_value & XR_KEYBOARD_TRACKING_CONNECTED_BIT_FB) != 0) {
        // Clear the value XR_KEYBOARD_TRACKING_CONNECTED_BIT_FB since it is valid
        int_value &= ~XR_KEYBOARD_TRACKING_CONNECTED_BIT_FB;
    }
    if (int_value != 0) {
        // Something is left, it must be invalid
        return VALIDATE_XR_FLAGS_INVALID;
    }
    return VALIDATE_XR_FLAGS_SUCCESS;
}